

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

void __thiscall tchecker::syncprod::system_t::system_t(system_t *this,system_t *system)

{
  tchecker::system::system_t::system_t(&this->super_system_t,system);
  memset(&this->super_labels_t,0,0x98);
  extract_asynchronous_edges(this);
  compute_committed_locations(this);
  compute_labels(this);
  return;
}

Assistant:

system_t::system_t(tchecker::system::system_t const & system) : tchecker::system::system_t(system)
{
  extract_asynchronous_edges();
  compute_committed_locations();
  compute_labels();
}